

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_7_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c6;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_c38;
  float c6s;
  float *input6;
  float *pfStack_c28;
  float c5s;
  float *input5;
  float *pfStack_c18;
  float c4s;
  float *input4;
  float *pfStack_c08;
  float c3s;
  float *input3;
  float *pfStack_bf8;
  float c2s;
  float *input2;
  float *pfStack_be8;
  float c1s;
  float *input1;
  float *pfStack_bd8;
  float c0s;
  float *input0;
  float *output;
  float *input0_end_local;
  float **inputs_local;
  float *vertical_coefficients_local;
  float *outputp_local;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  
  fVar1 = *vertical_coefficients;
  pfStack_be8 = inputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_bf8 = inputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_c08 = inputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_c18 = inputs[4];
  fVar5 = vertical_coefficients[4];
  pfStack_c28 = inputs[5];
  fVar6 = vertical_coefficients[5];
  pfStack_c38 = inputs[6];
  fVar7 = vertical_coefficients[6];
  input0 = outputp;
  for (pfStack_bd8 = *inputs; 0x3f < (long)input0_end - (long)pfStack_bd8;
      pfStack_bd8 = pfStack_bd8 + 0x10) {
    local_578 = (float)*(undefined8 *)pfStack_bd8;
    fStack_574 = (float)((ulong)*(undefined8 *)pfStack_bd8 >> 0x20);
    fStack_570 = (float)*(undefined8 *)(pfStack_bd8 + 2);
    fStack_56c = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 2) >> 0x20);
    local_118 = (float)*(undefined8 *)input0;
    fStack_114 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_110 = (float)*(undefined8 *)(input0 + 2);
    fStack_10c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_598 = (float)*(undefined8 *)(pfStack_bd8 + 4);
    fStack_594 = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 4) >> 0x20);
    fStack_590 = (float)*(undefined8 *)(pfStack_bd8 + 6);
    fStack_58c = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 6) >> 0x20);
    local_138 = (float)*(undefined8 *)(input0 + 4);
    fStack_134 = (float)((ulong)*(undefined8 *)(input0 + 4) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(input0 + 6);
    fStack_12c = (float)((ulong)*(undefined8 *)(input0 + 6) >> 0x20);
    local_5b8 = (float)*(undefined8 *)(pfStack_bd8 + 8);
    fStack_5b4 = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 8) >> 0x20);
    fStack_5b0 = (float)*(undefined8 *)(pfStack_bd8 + 10);
    fStack_5ac = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 10) >> 0x20);
    local_158 = (float)*(undefined8 *)(input0 + 8);
    fStack_154 = (float)((ulong)*(undefined8 *)(input0 + 8) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(input0 + 10);
    fStack_14c = (float)((ulong)*(undefined8 *)(input0 + 10) >> 0x20);
    local_5d8 = (float)*(undefined8 *)(pfStack_bd8 + 0xc);
    fStack_5d4 = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 0xc) >> 0x20);
    fStack_5d0 = (float)*(undefined8 *)(pfStack_bd8 + 0xe);
    fStack_5cc = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 0xe) >> 0x20);
    local_178 = (float)*(undefined8 *)(input0 + 0xc);
    fStack_174 = (float)((ulong)*(undefined8 *)(input0 + 0xc) >> 0x20);
    fStack_170 = (float)*(undefined8 *)(input0 + 0xe);
    fStack_16c = (float)((ulong)*(undefined8 *)(input0 + 0xe) >> 0x20);
    local_5f8 = (float)*(undefined8 *)pfStack_be8;
    fStack_5f4 = (float)((ulong)*(undefined8 *)pfStack_be8 >> 0x20);
    fStack_5f0 = (float)*(undefined8 *)(pfStack_be8 + 2);
    fStack_5ec = (float)((ulong)*(undefined8 *)(pfStack_be8 + 2) >> 0x20);
    local_618 = (float)*(undefined8 *)(pfStack_be8 + 4);
    fStack_614 = (float)((ulong)*(undefined8 *)(pfStack_be8 + 4) >> 0x20);
    fStack_610 = (float)*(undefined8 *)(pfStack_be8 + 6);
    fStack_60c = (float)((ulong)*(undefined8 *)(pfStack_be8 + 6) >> 0x20);
    local_638 = (float)*(undefined8 *)(pfStack_be8 + 8);
    fStack_634 = (float)((ulong)*(undefined8 *)(pfStack_be8 + 8) >> 0x20);
    fStack_630 = (float)*(undefined8 *)(pfStack_be8 + 10);
    fStack_62c = (float)((ulong)*(undefined8 *)(pfStack_be8 + 10) >> 0x20);
    local_658 = (float)*(undefined8 *)(pfStack_be8 + 0xc);
    fStack_654 = (float)((ulong)*(undefined8 *)(pfStack_be8 + 0xc) >> 0x20);
    fStack_650 = (float)*(undefined8 *)(pfStack_be8 + 0xe);
    fStack_64c = (float)((ulong)*(undefined8 *)(pfStack_be8 + 0xe) >> 0x20);
    local_678 = (float)*(undefined8 *)pfStack_bf8;
    fStack_674 = (float)((ulong)*(undefined8 *)pfStack_bf8 >> 0x20);
    fStack_670 = (float)*(undefined8 *)(pfStack_bf8 + 2);
    fStack_66c = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 2) >> 0x20);
    local_698 = (float)*(undefined8 *)(pfStack_bf8 + 4);
    fStack_694 = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 4) >> 0x20);
    fStack_690 = (float)*(undefined8 *)(pfStack_bf8 + 6);
    fStack_68c = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 6) >> 0x20);
    local_6b8 = (float)*(undefined8 *)(pfStack_bf8 + 8);
    fStack_6b4 = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 8) >> 0x20);
    fStack_6b0 = (float)*(undefined8 *)(pfStack_bf8 + 10);
    fStack_6ac = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 10) >> 0x20);
    local_6d8 = (float)*(undefined8 *)(pfStack_bf8 + 0xc);
    fStack_6d4 = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 0xc) >> 0x20);
    fStack_6d0 = (float)*(undefined8 *)(pfStack_bf8 + 0xe);
    fStack_6cc = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 0xe) >> 0x20);
    local_6f8 = (float)*(undefined8 *)pfStack_c08;
    fStack_6f4 = (float)((ulong)*(undefined8 *)pfStack_c08 >> 0x20);
    fStack_6f0 = (float)*(undefined8 *)(pfStack_c08 + 2);
    fStack_6ec = (float)((ulong)*(undefined8 *)(pfStack_c08 + 2) >> 0x20);
    local_718 = (float)*(undefined8 *)(pfStack_c08 + 4);
    fStack_714 = (float)((ulong)*(undefined8 *)(pfStack_c08 + 4) >> 0x20);
    fStack_710 = (float)*(undefined8 *)(pfStack_c08 + 6);
    fStack_70c = (float)((ulong)*(undefined8 *)(pfStack_c08 + 6) >> 0x20);
    local_738 = (float)*(undefined8 *)(pfStack_c08 + 8);
    fStack_734 = (float)((ulong)*(undefined8 *)(pfStack_c08 + 8) >> 0x20);
    fStack_730 = (float)*(undefined8 *)(pfStack_c08 + 10);
    fStack_72c = (float)((ulong)*(undefined8 *)(pfStack_c08 + 10) >> 0x20);
    local_758 = (float)*(undefined8 *)(pfStack_c08 + 0xc);
    fStack_754 = (float)((ulong)*(undefined8 *)(pfStack_c08 + 0xc) >> 0x20);
    fStack_750 = (float)*(undefined8 *)(pfStack_c08 + 0xe);
    fStack_74c = (float)((ulong)*(undefined8 *)(pfStack_c08 + 0xe) >> 0x20);
    local_778 = (float)*(undefined8 *)pfStack_c18;
    fStack_774 = (float)((ulong)*(undefined8 *)pfStack_c18 >> 0x20);
    fStack_770 = (float)*(undefined8 *)(pfStack_c18 + 2);
    fStack_76c = (float)((ulong)*(undefined8 *)(pfStack_c18 + 2) >> 0x20);
    local_798 = (float)*(undefined8 *)(pfStack_c18 + 4);
    fStack_794 = (float)((ulong)*(undefined8 *)(pfStack_c18 + 4) >> 0x20);
    fStack_790 = (float)*(undefined8 *)(pfStack_c18 + 6);
    fStack_78c = (float)((ulong)*(undefined8 *)(pfStack_c18 + 6) >> 0x20);
    local_7b8 = (float)*(undefined8 *)(pfStack_c18 + 8);
    fStack_7b4 = (float)((ulong)*(undefined8 *)(pfStack_c18 + 8) >> 0x20);
    fStack_7b0 = (float)*(undefined8 *)(pfStack_c18 + 10);
    fStack_7ac = (float)((ulong)*(undefined8 *)(pfStack_c18 + 10) >> 0x20);
    local_7d8 = (float)*(undefined8 *)(pfStack_c18 + 0xc);
    fStack_7d4 = (float)((ulong)*(undefined8 *)(pfStack_c18 + 0xc) >> 0x20);
    fStack_7d0 = (float)*(undefined8 *)(pfStack_c18 + 0xe);
    fStack_7cc = (float)((ulong)*(undefined8 *)(pfStack_c18 + 0xe) >> 0x20);
    local_7f8 = (float)*(undefined8 *)pfStack_c28;
    fStack_7f4 = (float)((ulong)*(undefined8 *)pfStack_c28 >> 0x20);
    fStack_7f0 = (float)*(undefined8 *)(pfStack_c28 + 2);
    fStack_7ec = (float)((ulong)*(undefined8 *)(pfStack_c28 + 2) >> 0x20);
    local_818 = (float)*(undefined8 *)(pfStack_c28 + 4);
    fStack_814 = (float)((ulong)*(undefined8 *)(pfStack_c28 + 4) >> 0x20);
    fStack_810 = (float)*(undefined8 *)(pfStack_c28 + 6);
    fStack_80c = (float)((ulong)*(undefined8 *)(pfStack_c28 + 6) >> 0x20);
    local_838 = (float)*(undefined8 *)(pfStack_c28 + 8);
    fStack_834 = (float)((ulong)*(undefined8 *)(pfStack_c28 + 8) >> 0x20);
    fStack_830 = (float)*(undefined8 *)(pfStack_c28 + 10);
    fStack_82c = (float)((ulong)*(undefined8 *)(pfStack_c28 + 10) >> 0x20);
    local_858 = (float)*(undefined8 *)(pfStack_c28 + 0xc);
    fStack_854 = (float)((ulong)*(undefined8 *)(pfStack_c28 + 0xc) >> 0x20);
    fStack_850 = (float)*(undefined8 *)(pfStack_c28 + 0xe);
    fStack_84c = (float)((ulong)*(undefined8 *)(pfStack_c28 + 0xe) >> 0x20);
    local_878 = (float)*(undefined8 *)pfStack_c38;
    fStack_874 = (float)((ulong)*(undefined8 *)pfStack_c38 >> 0x20);
    fStack_870 = (float)*(undefined8 *)(pfStack_c38 + 2);
    fStack_86c = (float)((ulong)*(undefined8 *)(pfStack_c38 + 2) >> 0x20);
    o1[3] = fStack_114 + fStack_574 * fVar1 + fStack_5f4 * fVar2 + fStack_674 * fVar3 +
            fStack_6f4 * fVar4 + fStack_774 * fVar5 + fStack_7f4 * fVar6 + fStack_874 * fVar7;
    o1[2] = local_118 + local_578 * fVar1 + local_5f8 * fVar2 + local_678 * fVar3 +
            local_6f8 * fVar4 + local_778 * fVar5 + local_7f8 * fVar6 + local_878 * fVar7;
    o0[1] = fStack_10c + fStack_56c * fVar1 + fStack_5ec * fVar2 + fStack_66c * fVar3 +
            fStack_6ec * fVar4 + fStack_76c * fVar5 + fStack_7ec * fVar6 + fStack_86c * fVar7;
    o0[0] = fStack_110 + fStack_570 * fVar1 + fStack_5f0 * fVar2 + fStack_670 * fVar3 +
            fStack_6f0 * fVar4 + fStack_770 * fVar5 + fStack_7f0 * fVar6 + fStack_870 * fVar7;
    local_898 = (float)*(undefined8 *)(pfStack_c38 + 4);
    fStack_894 = (float)((ulong)*(undefined8 *)(pfStack_c38 + 4) >> 0x20);
    fStack_890 = (float)*(undefined8 *)(pfStack_c38 + 6);
    fStack_88c = (float)((ulong)*(undefined8 *)(pfStack_c38 + 6) >> 0x20);
    o2[3] = fStack_134 + fStack_594 * fVar1 + fStack_614 * fVar2 + fStack_694 * fVar3 +
            fStack_714 * fVar4 + fStack_794 * fVar5 + fStack_814 * fVar6 + fStack_894 * fVar7;
    o2[2] = local_138 + local_598 * fVar1 + local_618 * fVar2 + local_698 * fVar3 +
            local_718 * fVar4 + local_798 * fVar5 + local_818 * fVar6 + local_898 * fVar7;
    o1[1] = fStack_12c + fStack_58c * fVar1 + fStack_60c * fVar2 + fStack_68c * fVar3 +
            fStack_70c * fVar4 + fStack_78c * fVar5 + fStack_80c * fVar6 + fStack_88c * fVar7;
    o1[0] = fStack_130 + fStack_590 * fVar1 + fStack_610 * fVar2 + fStack_690 * fVar3 +
            fStack_710 * fVar4 + fStack_790 * fVar5 + fStack_810 * fVar6 + fStack_890 * fVar7;
    local_8b8 = (float)*(undefined8 *)(pfStack_c38 + 8);
    fStack_8b4 = (float)((ulong)*(undefined8 *)(pfStack_c38 + 8) >> 0x20);
    fStack_8b0 = (float)*(undefined8 *)(pfStack_c38 + 10);
    fStack_8ac = (float)((ulong)*(undefined8 *)(pfStack_c38 + 10) >> 0x20);
    o3[3] = fStack_154 + fStack_5b4 * fVar1 + fStack_634 * fVar2 + fStack_6b4 * fVar3 +
            fStack_734 * fVar4 + fStack_7b4 * fVar5 + fStack_834 * fVar6 + fStack_8b4 * fVar7;
    o3[2] = local_158 + local_5b8 * fVar1 + local_638 * fVar2 + local_6b8 * fVar3 +
            local_738 * fVar4 + local_7b8 * fVar5 + local_838 * fVar6 + local_8b8 * fVar7;
    o2[1] = fStack_14c + fStack_5ac * fVar1 + fStack_62c * fVar2 + fStack_6ac * fVar3 +
            fStack_72c * fVar4 + fStack_7ac * fVar5 + fStack_82c * fVar6 + fStack_8ac * fVar7;
    o2[0] = fStack_150 + fStack_5b0 * fVar1 + fStack_630 * fVar2 + fStack_6b0 * fVar3 +
            fStack_730 * fVar4 + fStack_7b0 * fVar5 + fStack_830 * fVar6 + fStack_8b0 * fVar7;
    local_8d8 = (float)*(undefined8 *)(pfStack_c38 + 0xc);
    fStack_8d4 = (float)((ulong)*(undefined8 *)(pfStack_c38 + 0xc) >> 0x20);
    fStack_8d0 = (float)*(undefined8 *)(pfStack_c38 + 0xe);
    fStack_8cc = (float)((ulong)*(undefined8 *)(pfStack_c38 + 0xe) >> 0x20);
    r0[3] = fStack_174 + fStack_5d4 * fVar1 + fStack_654 * fVar2 + fStack_6d4 * fVar3 +
            fStack_754 * fVar4 + fStack_7d4 * fVar5 + fStack_854 * fVar6 + fStack_8d4 * fVar7;
    r0[2] = local_178 + local_5d8 * fVar1 + local_658 * fVar2 + local_6d8 * fVar3 +
            local_758 * fVar4 + local_7d8 * fVar5 + local_858 * fVar6 + local_8d8 * fVar7;
    o3[1] = fStack_16c + fStack_5cc * fVar1 + fStack_64c * fVar2 + fStack_6cc * fVar3 +
            fStack_74c * fVar4 + fStack_7cc * fVar5 + fStack_84c * fVar6 + fStack_8cc * fVar7;
    o3[0] = fStack_170 + fStack_5d0 * fVar1 + fStack_650 * fVar2 + fStack_6d0 * fVar3 +
            fStack_750 * fVar4 + fStack_7d0 * fVar5 + fStack_850 * fVar6 + fStack_8d0 * fVar7;
    *(undefined8 *)input0 = o1._8_8_;
    *(undefined8 *)(input0 + 2) = o0._0_8_;
    *(undefined8 *)(input0 + 4) = o2._8_8_;
    *(undefined8 *)(input0 + 6) = o1._0_8_;
    *(undefined8 *)(input0 + 8) = o3._8_8_;
    *(undefined8 *)(input0 + 10) = o2._0_8_;
    *(undefined8 *)(input0 + 0xc) = r0._8_8_;
    *(undefined8 *)(input0 + 0xe) = o3._0_8_;
    input0 = input0 + 0x10;
    pfStack_be8 = pfStack_be8 + 0x10;
    pfStack_bf8 = pfStack_bf8 + 0x10;
    pfStack_c08 = pfStack_c08 + 0x10;
    pfStack_c18 = pfStack_c18 + 0x10;
    pfStack_c28 = pfStack_c28 + 0x10;
    pfStack_c38 = pfStack_c38 + 0x10;
  }
  for (; 0xf < (long)input0_end - (long)pfStack_bd8; pfStack_bd8 = pfStack_bd8 + 4) {
    local_8f8 = (float)*(undefined8 *)pfStack_bd8;
    fStack_8f4 = (float)((ulong)*(undefined8 *)pfStack_bd8 >> 0x20);
    fStack_8f0 = (float)*(undefined8 *)(pfStack_bd8 + 2);
    fStack_8ec = (float)((ulong)*(undefined8 *)(pfStack_bd8 + 2) >> 0x20);
    local_498 = (float)*(undefined8 *)input0;
    fStack_494 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_490 = (float)*(undefined8 *)(input0 + 2);
    fStack_48c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_918 = (float)*(undefined8 *)pfStack_be8;
    fStack_914 = (float)((ulong)*(undefined8 *)pfStack_be8 >> 0x20);
    fStack_910 = (float)*(undefined8 *)(pfStack_be8 + 2);
    fStack_90c = (float)((ulong)*(undefined8 *)(pfStack_be8 + 2) >> 0x20);
    local_938 = (float)*(undefined8 *)pfStack_bf8;
    fStack_934 = (float)((ulong)*(undefined8 *)pfStack_bf8 >> 0x20);
    fStack_930 = (float)*(undefined8 *)(pfStack_bf8 + 2);
    fStack_92c = (float)((ulong)*(undefined8 *)(pfStack_bf8 + 2) >> 0x20);
    local_958 = (float)*(undefined8 *)pfStack_c08;
    fStack_954 = (float)((ulong)*(undefined8 *)pfStack_c08 >> 0x20);
    fStack_950 = (float)*(undefined8 *)(pfStack_c08 + 2);
    fStack_94c = (float)((ulong)*(undefined8 *)(pfStack_c08 + 2) >> 0x20);
    local_978 = (float)*(undefined8 *)pfStack_c18;
    fStack_974 = (float)((ulong)*(undefined8 *)pfStack_c18 >> 0x20);
    fStack_970 = (float)*(undefined8 *)(pfStack_c18 + 2);
    fStack_96c = (float)((ulong)*(undefined8 *)(pfStack_c18 + 2) >> 0x20);
    local_998 = (float)*(undefined8 *)pfStack_c28;
    fStack_994 = (float)((ulong)*(undefined8 *)pfStack_c28 >> 0x20);
    fStack_990 = (float)*(undefined8 *)(pfStack_c28 + 2);
    fStack_98c = (float)((ulong)*(undefined8 *)(pfStack_c28 + 2) >> 0x20);
    local_9b8 = (float)*(undefined8 *)pfStack_c38;
    fStack_9b4 = (float)((ulong)*(undefined8 *)pfStack_c38 >> 0x20);
    fStack_9b0 = (float)*(undefined8 *)(pfStack_c38 + 2);
    fStack_9ac = (float)((ulong)*(undefined8 *)(pfStack_c38 + 2) >> 0x20);
    r0_1[3] = fStack_494 + fStack_8f4 * fVar1 + fStack_914 * fVar2 + fStack_934 * fVar3 +
              fStack_954 * fVar4 + fStack_974 * fVar5 + fStack_994 * fVar6 + fStack_9b4 * fVar7;
    r0_1[2] = local_498 + local_8f8 * fVar1 + local_918 * fVar2 + local_938 * fVar3 +
              local_958 * fVar4 + local_978 * fVar5 + local_998 * fVar6 + local_9b8 * fVar7;
    o0_1[1] = fStack_48c + fStack_8ec * fVar1 + fStack_90c * fVar2 + fStack_92c * fVar3 +
              fStack_94c * fVar4 + fStack_96c * fVar5 + fStack_98c * fVar6 + fStack_9ac * fVar7;
    o0_1[0] = fStack_490 + fStack_8f0 * fVar1 + fStack_910 * fVar2 + fStack_930 * fVar3 +
              fStack_950 * fVar4 + fStack_970 * fVar5 + fStack_990 * fVar6 + fStack_9b0 * fVar7;
    *(undefined8 *)input0 = r0_1._8_8_;
    *(undefined8 *)(input0 + 2) = o0_1._0_8_;
    input0 = input0 + 4;
    pfStack_be8 = pfStack_be8 + 4;
    pfStack_bf8 = pfStack_bf8 + 4;
    pfStack_c08 = pfStack_c08 + 4;
    pfStack_c18 = pfStack_c18 + 4;
    pfStack_c28 = pfStack_c28 + 4;
    pfStack_c38 = pfStack_c38 + 4;
  }
  for (; pfStack_bd8 < input0_end; pfStack_bd8 = pfStack_bd8 + 1) {
    *input0 = *pfStack_c38 * fVar7 +
              *pfStack_c28 * fVar6 +
              *pfStack_c18 * fVar5 +
              *pfStack_c08 * fVar4 +
              *pfStack_bf8 * fVar3 + *pfStack_be8 * fVar2 + *input0 + *pfStack_bd8 * fVar1;
    input0 = input0 + 1;
    pfStack_be8 = pfStack_be8 + 1;
    pfStack_bf8 = pfStack_bf8 + 1;
    pfStack_c08 = pfStack_c08 + 1;
    pfStack_c18 = pfStack_c18 + 1;
    pfStack_c28 = pfStack_c28 + 1;
    pfStack_c38 = pfStack_c38 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}